

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileArgument(LlvmCompilationContext *ctx,TypeBase *argumentType,ExprBase *value)

{
  TypeBase *valueType;
  LLVMValueRef pLVar1;
  TypeBase *valueType_00;
  
  pLVar1 = CompileLlvm(ctx,value);
  valueType = value->type;
  valueType_00 = GetStackType(ctx,valueType);
  pLVar1 = ConvertToDataType(ctx,pLVar1,valueType_00,valueType);
  return pLVar1;
}

Assistant:

LLVMValueRef CompileArgument(LlvmCompilationContext& ctx, TypeBase* argumentType, ExprBase* value)
{
	LLVMValueRef argument = CompileLlvm(ctx, value);

	argument = ConvertToDataType(ctx, argument, GetStackType(ctx, value->type), value->type);

	return CompileArgument(ctx, argumentType, argument);
}